

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O1

void apply_imputation_results<PredictionData<double,int>,ImputedData<int,double>>
               (PredictionData<double,_int> *prediction_data,ImputedData<int,_double> *imp,
               Imputer *imputer,size_t row)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  pointer puVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  unsigned_long uVar9;
  pointer piVar10;
  pointer pvVar11;
  pointer pvVar12;
  int *piVar13;
  double *pdVar14;
  double *pdVar15;
  size_t sVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  double *pdVar20;
  double *pdVar21;
  double *pdVar22;
  size_t sVar23;
  double dVar24;
  
  bVar2 = prediction_data->is_col_major;
  sVar4 = imp->n_missing_num;
  if (bVar2 == false) {
    if (sVar4 != 0) {
      puVar5 = (imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar6 = (imp->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (imp->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar16 = imputer->ncols_numeric;
      pdVar22 = prediction_data->numeric_data;
      pdVar8 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar23 = 0;
      do {
        uVar9 = puVar5[sVar23];
        dVar1 = pdVar7[sVar23];
        if (((dVar1 <= 0.0) || (dVar24 = pdVar6[sVar23], 0x7fefffffffffffff < (ulong)ABS(dVar24)))
           || ((dVar24 == 0.0 && ((!NAN(dVar24) && (NAN(pdVar8[uVar9]))))))) {
          dVar24 = pdVar8[uVar9];
        }
        else {
          dVar24 = dVar24 / dVar1;
        }
        pdVar22[sVar16 * row + uVar9] = dVar24;
        sVar23 = sVar23 + 1;
      } while (sVar4 != sVar23);
    }
  }
  else if (sVar4 != 0) {
    puVar5 = (imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar6 = (imp->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (imp->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar22 = prediction_data->numeric_data;
    sVar16 = prediction_data->nrows;
    sVar23 = 0;
    do {
      uVar9 = puVar5[sVar23];
      dVar1 = pdVar7[sVar23];
      if (((dVar1 <= 0.0) || (dVar24 = pdVar6[sVar23], 0x7fefffffffffffff < (ulong)ABS(dVar24))) ||
         ((dVar24 == 0.0 && ((!NAN(dVar24) && (NAN(pdVar8[uVar9]))))))) {
        dVar24 = pdVar8[uVar9];
      }
      else {
        dVar24 = dVar24 / dVar1;
      }
      pdVar22[row + uVar9 * sVar16] = dVar24;
      sVar23 = sVar23 + 1;
    } while (sVar4 != sVar23);
  }
  pdVar22 = prediction_data->Xr;
  if (pdVar22 != (double *)0x0) {
    iVar18 = prediction_data->Xr_indptr[row];
    lVar17 = (long)iVar18;
    iVar3 = prediction_data->Xr_indptr[row + 1];
    if (iVar18 < iVar3) {
      pdVar6 = (imp->sp_num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (imp->sp_num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar10 = (imp->missing_sp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar8 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar19 = 0;
      do {
        if (0x7fefffffffffffff < (ulong)ABS(pdVar22[lVar17])) {
          dVar1 = pdVar7[lVar19];
          if ((dVar1 <= 0.0) || (dVar24 = pdVar6[lVar19], 0x7fefffffffffffff < (ulong)ABS(dVar24)))
          {
            dVar24 = pdVar8[piVar10[lVar19]];
          }
          else {
            dVar24 = dVar24 / dVar1;
          }
          pdVar22[lVar17] = dVar24;
          lVar19 = lVar19 + 1;
        }
        lVar17 = lVar17 + 1;
      } while (iVar3 != lVar17);
    }
  }
  sVar4 = imp->n_missing_cat;
  if (bVar2 == false) {
    if (sVar4 != 0) {
      puVar5 = (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar17 = row * imputer->ncols_categ;
      pvVar11 = (imp->cat_sum).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      piVar13 = prediction_data->categ_data;
      pvVar12 = (imp->cat_sum).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      piVar10 = (imputer->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      sVar16 = 0;
      do {
        uVar9 = puVar5[sVar16];
        pdVar14 = pvVar11[uVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar15 = pvVar11[uVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pdVar22 = pdVar14 + 1;
        pdVar20 = pdVar14;
        pdVar21 = pdVar14;
        if (pdVar22 != pdVar15 && pdVar14 != pdVar15) {
          do {
            pdVar21 = pdVar22;
            if (*pdVar22 < *pdVar20 || *pdVar22 == *pdVar20) {
              pdVar21 = pdVar20;
            }
            pdVar22 = pdVar22 + 1;
            pdVar20 = pdVar21;
          } while (pdVar22 != pdVar15);
        }
        iVar18 = (int)((ulong)((long)pdVar21 - (long)pdVar14) >> 3);
        piVar13[lVar17 + uVar9] = iVar18;
        if (iVar18 == 0) {
          iVar18 = -1;
          if ((pdVar14 != pdVar15) && (pvVar11 != pvVar12)) {
            if (0.0 < *pdVar14) goto LAB_001d4ddd;
            iVar18 = piVar10[uVar9];
          }
          piVar13[lVar17 + uVar9] = iVar18;
        }
LAB_001d4ddd:
        sVar16 = sVar16 + 1;
      } while (sVar16 != sVar4);
    }
  }
  else if (sVar4 != 0) {
    puVar5 = (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pvVar11 = (imp->cat_sum).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar12 = (imp->cat_sum).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    piVar13 = prediction_data->categ_data;
    sVar16 = prediction_data->nrows;
    piVar10 = (imputer->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    sVar23 = 0;
    do {
      uVar9 = puVar5[sVar23];
      pdVar14 = pvVar11[uVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar15 = pvVar11[uVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pdVar22 = pdVar14 + 1;
      pdVar20 = pdVar14;
      pdVar21 = pdVar14;
      if (pdVar22 != pdVar15 && pdVar14 != pdVar15) {
        do {
          pdVar20 = pdVar22;
          if (*pdVar22 < *pdVar21 || *pdVar22 == *pdVar21) {
            pdVar20 = pdVar21;
          }
          pdVar22 = pdVar22 + 1;
          pdVar21 = pdVar20;
        } while (pdVar22 != pdVar15);
      }
      lVar17 = sVar16 * uVar9;
      iVar18 = (int)((ulong)((long)pdVar20 - (long)pdVar14) >> 3);
      piVar13[row + lVar17] = iVar18;
      if (iVar18 == 0) {
        iVar18 = -1;
        if ((pdVar14 != pdVar15) && (pvVar11 != pvVar12)) {
          if (0.0 < *pdVar14) goto LAB_001d4d1d;
          iVar18 = piVar10[uVar9];
        }
        piVar13[row + lVar17] = iVar18;
      }
LAB_001d4d1d:
      sVar23 = sVar23 + 1;
    } while (sVar23 != sVar4);
  }
  return;
}

Assistant:

void apply_imputation_results(PredictionData  &prediction_data,
                              ImputedData     &imp,
                              Imputer         &imputer,
                              size_t          row)
{
    size_t col;
    size_t pos = 0;
    if (prediction_data.is_col_major)
    {
        for (size_t ix = 0; ix < imp.n_missing_num; ix++)
        {
            col = imp.missing_num[ix];
            if (imp.num_weight[ix] > 0 && !is_na_or_inf(imp.num_sum[ix]) && !(imp.num_sum[ix] == 0 && std::isnan(imputer.col_means[col])))
                prediction_data.numeric_data[row + col * prediction_data.nrows]
                    =
                imp.num_sum[ix] / imp.num_weight[ix];
            else
                prediction_data.numeric_data[row + col * prediction_data.nrows]
                    =
                imputer.col_means[col];
        }
    }

    else
    {
        for (size_t ix = 0; ix < imp.n_missing_num; ix++)
        {
            col = imp.missing_num[ix];
            if (imp.num_weight[ix] > 0 && !is_na_or_inf(imp.num_sum[ix]) && !(imp.num_sum[ix] == 0 && std::isnan(imputer.col_means[col])))
                prediction_data.numeric_data[col + row * imputer.ncols_numeric]
                    =
                imp.num_sum[ix] / imp.num_weight[ix];
            else
                prediction_data.numeric_data[col + row * imputer.ncols_numeric]
                    =
                imputer.col_means[col];
        }
    }

    if (prediction_data.Xr != NULL)
        for (auto ix = prediction_data.Xr_indptr[row]; ix < prediction_data.Xr_indptr[row + 1]; ix++)
        {
            if (is_na_or_inf(prediction_data.Xr[ix]))
            {
                if (imp.sp_num_weight[pos] > 0 && !is_na_or_inf(imp.sp_num_sum[pos]))
                    prediction_data.Xr[ix]
                        =
                    imp.sp_num_sum[pos] / imp.sp_num_weight[pos];
                else
                    prediction_data.Xr[ix]
                        =
                    imputer.col_means[imp.missing_sp[pos]];
                pos++;
            }
        }

    if (prediction_data.is_col_major)
    {
        for (size_t ix = 0; ix < imp.n_missing_cat; ix++)
        {
            col = imp.missing_cat[ix];
            prediction_data.categ_data[row + col * prediction_data.nrows]
                        =
            std::distance(imp.cat_sum[col].begin(),
                          std::max_element(imp.cat_sum[col].begin(), imp.cat_sum[col].end()));

            if (prediction_data.categ_data[row + col * prediction_data.nrows] == 0)
            {
                if (imp.cat_sum.empty() || imp.cat_sum[col].empty())
                {
                    prediction_data.categ_data[row + col * prediction_data.nrows] = -1;
                }

                else if (imp.cat_sum[col][0] <= 0)
                {
                    prediction_data.categ_data[row + col * prediction_data.nrows]
                        =
                    imputer.col_modes[col];
                }
            }
        }
    }

    else
    {
        for (size_t ix = 0; ix < imp.n_missing_cat; ix++)
        {
            col = imp.missing_cat[ix];
            prediction_data.categ_data[col + row * imputer.ncols_categ]
                        =
            std::distance(imp.cat_sum[col].begin(),
                          std::max_element(imp.cat_sum[col].begin(), imp.cat_sum[col].end()));

            if (prediction_data.categ_data[col + row * imputer.ncols_categ] == 0)
            {
                if (imp.cat_sum.empty() || imp.cat_sum[col].empty())
                {
                    prediction_data.categ_data[col + row * imputer.ncols_categ] = -1;
                }
                
                else if (imp.cat_sum[col][0] <= 0)
                {
                    prediction_data.categ_data[col + row * imputer.ncols_categ]
                        =
                    imputer.col_modes[col];
                }
            }
        }
    }
}